

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_ssm_conv::build_graph(test_ssm_conv *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_context *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *b;
  ggml_tensor *a;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  ggml_context *in_stack_ffffffffffffffc8;
  ggml_context *ctx_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  
  uVar3 = *(undefined4 *)(in_RDI + 0x38);
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1958d2);
  pgVar1 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,(ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      (int64_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
  uVar4 = *(undefined4 *)(in_RDI + 0x38);
  ctx_00 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x195911);
  pgVar2 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),ctx_00,
                      (ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      (int64_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
  pgVar1 = (ggml_tensor *)ggml_ssm_conv(in_RSI,pgVar1,pgVar2);
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a   = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_tensor * b   = ggml_new_tensor(ctx, type, 4, ne_b.data());
        ggml_tensor * out = ggml_ssm_conv(ctx, a, b);
        return out;
    }